

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

Id __thiscall
dxil_spv::SPIRVModule::Impl::get_helper_call_id
          (Impl *this,SPIRVModule *module,HelperCall call,Id *aux_ids,uint32_t aux_ids_count)

{
  Id IVar1;
  
  switch(call) {
  case NodeCoalescePayloadOffset:
    IVar1 = build_node_coalesce_payload_offset(this,module,aux_ids,aux_ids_count);
    return IVar1;
  default:
    return 0;
  case CoopMatFP8toFP16:
    IVar1 = build_coop_mat_fp8_to_fp16(this,module,aux_ids,aux_ids_count);
    return IVar1;
  case CoopMatFP16toFP8:
    IVar1 = build_coop_mat_fp16_to_fp8(this,module,aux_ids,aux_ids_count);
    return IVar1;
  case CoopMatTransfer:
    IVar1 = build_coop_mat_transfer(this,module,aux_ids,aux_ids_count);
    return IVar1;
  }
}

Assistant:

spv::Id SPIRVModule::Impl::get_helper_call_id(SPIRVModule &module, HelperCall call,
                                              const spv::Id *aux_ids, uint32_t aux_ids_count)
{
	switch (call)
	{
	case HelperCall::NodeCoalescePayloadOffset:
		return build_node_coalesce_payload_offset(module, aux_ids, aux_ids_count);
	case HelperCall::CoopMatFP8toFP16:
		return build_coop_mat_fp8_to_fp16(module, aux_ids, aux_ids_count);
	case HelperCall::CoopMatFP16toFP8:
		return build_coop_mat_fp16_to_fp8(module, aux_ids, aux_ids_count);
	case HelperCall::CoopMatTransfer:
		return build_coop_mat_transfer(module, aux_ids, aux_ids_count);
	default:
		break;
	}
	return 0;
}